

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match_unittest.cc
# Opt level: O0

int bssl::VerifyNameMatchDifferingTypesTest_NormalizableTypesAreEqual_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<bssl::VerifyNameMatchDifferingTypesTest> *this_01;
  TestMetaFactoryBase<std::tuple<const_char_*,_const_char_*>_> *meta_factory;
  allocator<char> local_d9;
  string local_d8;
  CodeLocation local_b8;
  allocator<char> local_89;
  string local_88;
  CodeLocation local_68;
  allocator<char> local_29;
  string local_28;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"VerifyNameMatchDifferingTypesTest",&local_29);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_name_match_unittest.cc"
             ,&local_89);
  testing::internal::CodeLocation::CodeLocation(&local_68,&local_88,0xd8);
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<bssl::VerifyNameMatchDifferingTypesTest>
                      (this_00,&local_28,&local_68);
  meta_factory = (TestMetaFactoryBase<std::tuple<const_char_*,_const_char_*>_> *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)0x0;
  testing::internal::
  TestMetaFactory<bssl::VerifyNameMatchDifferingTypesTest_NormalizableTypesAreEqual_Test>::
  TestMetaFactory((TestMetaFactory<bssl::VerifyNameMatchDifferingTypesTest_NormalizableTypesAreEqual_Test>
                   *)meta_factory);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_name_match_unittest.cc"
             ,&local_d9);
  testing::internal::CodeLocation::CodeLocation(&local_b8,&local_d8,0xd8);
  testing::internal::ParameterizedTestSuiteInfo<bssl::VerifyNameMatchDifferingTypesTest>::
  AddTestPattern(this_01,"VerifyNameMatchDifferingTypesTest","NormalizableTypesAreEqual",
                 meta_factory,&local_b8);
  testing::internal::CodeLocation::~CodeLocation(&local_b8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::allocator<char>::~allocator(&local_d9);
  testing::internal::CodeLocation::~CodeLocation(&local_68);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::allocator<char>::~allocator(&local_89);
  ::std::__cxx11::string::~string((string *)&local_28);
  ::std::allocator<char>::~allocator(&local_29);
  return 0;
}

Assistant:

TEST_P(VerifyNameMatchDifferingTypesTest, NormalizableTypesAreEqual) {
  std::string der_1;
  ASSERT_TRUE(LoadTestData("ascii", value_type_1(), "unmangled", &der_1));
  std::string der_2;
  ASSERT_TRUE(LoadTestData("ascii", value_type_2(), "unmangled", &der_2));
  if (TypesAreComparable(value_type_1(), value_type_2())) {
    EXPECT_TRUE(VerifyNameMatch(SequenceValueFromString(der_1),
                                SequenceValueFromString(der_2)));
  } else {
    EXPECT_FALSE(VerifyNameMatch(SequenceValueFromString(der_1),
                                 SequenceValueFromString(der_2)));
  }
}